

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<solitaire::geometry::Position_()>::PerformDefaultAction
          (FunctionMocker<solitaire::geometry::Position_()> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<solitaire::geometry::Position_()> *this_00;
  Action<solitaire::geometry::Position_()> *pAVar1;
  Result RVar2;
  Position PVar3;
  Result RVar4;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<solitaire::geometry::Position_()> *)0x0) {
    pAVar1 = OnCallSpec<solitaire::geometry::Position_()>::GetAction(this_00);
    RVar2 = Action<solitaire::geometry::Position_()>::Perform(pAVar1);
    return RVar2;
  }
  std::operator+(&bStack_28,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  PVar3 = DefaultValue<solitaire::geometry::Position>::Get();
  std::__cxx11::string::~string((string *)&bStack_28);
  RVar4.x = PVar3.x;
  RVar4.y = PVar3.y;
  return RVar4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }